

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiWindow_conflict * ImGui::NavRestoreLastChildNavWindow(ImGuiWindow_conflict *window)

{
  ImGuiTabBar *tab_bar;
  ImGuiTabItem *pIVar1;
  ImGuiWindow *pIVar2;
  
  pIVar2 = (ImGuiWindow *)window->NavLastChildNavWindow;
  if ((((pIVar2 == (ImGuiWindow *)0x0) || (pIVar2->WasActive == false)) &&
      (pIVar2 = (ImGuiWindow *)window, window->DockNodeAsHost != (ImGuiDockNode *)0x0)) &&
     ((tab_bar = window->DockNodeAsHost->TabBar, tab_bar != (ImGuiTabBar *)0x0 &&
      (pIVar1 = TabBarFindMostRecentlySelectedTabForActiveWindow(tab_bar),
      pIVar1 != (ImGuiTabItem *)0x0)))) {
    pIVar2 = pIVar1->Window;
  }
  return (ImGuiWindow_conflict *)pIVar2;
}

Assistant:

static ImGuiWindow* ImGui::NavRestoreLastChildNavWindow(ImGuiWindow* window)
{
    if (window->NavLastChildNavWindow && window->NavLastChildNavWindow->WasActive)
        return window->NavLastChildNavWindow;
    if (window->DockNodeAsHost && window->DockNodeAsHost->TabBar)
        if (ImGuiTabItem* tab = TabBarFindMostRecentlySelectedTabForActiveWindow(window->DockNodeAsHost->TabBar))
            return tab->Window;
    return window;
}